

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O2

void gen_person(person_t *p)

{
  int iVar1;
  int iVar2;
  
  iVar2 = rand();
  iVar1 = 0xe;
  if (0xe < iVar2 % 0x400) {
    iVar1 = iVar2 % 0x400;
  }
  iVar2 = rand();
  p->age = iVar2 % 100;
  gen_random(p->key,iVar1 + -1);
  gen_random(p->name,iVar1 + -1);
  gen_random(p->city,0xc);
  gen_random(p->state,2);
  gen_random(p->desc,0x200);
  return;
}

Assistant:

void gen_person(person_t *p){

    int klen = rand() % MAXKEY_LEN - 1;
    if(klen<=MAXITR_LEN){
        klen=MAXITR_LEN+1;
    }
    p->age = rand() % 100;
    gen_random(p->key, klen);
    gen_random(p->name, klen);
    gen_random(p->city, 12);
    gen_random(p->state, 2);
    gen_random(p->desc, 512);

}